

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sAnalyzer.cpp
# Opt level: O2

void __thiscall I2sAnalyzer::SetupResults(I2sAnalyzer *this)

{
  I2sAnalyzerResults *this_00;
  
  this_00 = (I2sAnalyzerResults *)operator_new(0x20);
  I2sAnalyzerResults::I2sAnalyzerResults(this_00,this,(this->mSettings)._M_ptr);
  std::auto_ptr<I2sAnalyzerResults>::reset(&this->mResults,this_00);
  Analyzer::SetAnalyzerResults((AnalyzerResults *)this);
  AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)(this->mResults)._M_ptr);
  return;
}

Assistant:

void I2sAnalyzer::SetupResults()
{
    mResults.reset( new I2sAnalyzerResults( this, mSettings.get() ) );
    SetAnalyzerResults( mResults.get() );
    mResults->AddChannelBubblesWillAppearOn( mSettings->mDataChannel );
}